

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O2

int Sbd_ManCollectConstants
              (sat_solver *pSat,int *nCareMints,int PivotVar,word **pVarSims,Vec_Int_t *vInds)

{
  sat_solver *s;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int i;
  ulong uVar5;
  long lVar6;
  int iLit;
  int local_5c;
  sat_solver *local_58;
  Vec_Int_t *local_50;
  int *local_48;
  ulong local_40;
  long local_38;
  
  iVar1 = vInds->nSize;
  local_58 = pSat;
  local_48 = nCareMints;
  if (iVar1 != nCareMints[1] + *nCareMints) {
    __assert_fail("Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0x19f,
                  "int Sbd_ManCollectConstants(sat_solver *, int *, int, word **, Vec_Int_t *)");
  }
  local_38 = (long)PivotVar;
  uVar5 = 0;
  local_5c = PivotVar;
  local_50 = vInds;
  while( true ) {
    iVar3 = local_5c;
    i = (int)uVar5;
    if (iVar1 <= i) {
      return -1;
    }
    uVar2 = Vec_IntEntry(local_50,i);
    iVar1 = *local_48;
    local_40 = uVar5;
    iLit = Abc_Var2Lit(iVar3,(uint)(i < iVar1));
    s = local_58;
    sat_solver_random_polarity(local_58);
    iVar3 = sat_solver_solve(s,&iLit,&local_5c,0,0,0,0);
    if (iVar3 == -1) break;
    if (iVar3 == 0) {
      return -2;
    }
    for (lVar6 = 0; lVar6 <= local_38; lVar6 = lVar6 + 1) {
      uVar5 = pVarSims[lVar6][(int)uVar2 >> 6];
      uVar4 = sat_solver_var_value(local_58,(int)lVar6);
      if (((uVar5 >> (ulong)(uVar2 & 0x3f) & 1) != 0) != uVar4) {
        pVarSims[lVar6][(int)uVar2 >> 6] =
             pVarSims[lVar6][(int)uVar2 >> 6] ^ 1L << (sbyte)(uVar2 & 0x3f);
      }
    }
    uVar5 = (ulong)((int)local_40 + 1);
    iVar1 = local_50->nSize;
  }
  return (uint)(i < iVar1);
}

Assistant:

int Sbd_ManCollectConstants( sat_solver * pSat, int nCareMints[2], int PivotVar, word * pVarSims[], Vec_Int_t * vInds )
{
    int nBTLimit = 0;
    int i, Ind; 
    assert( Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1] );
    Vec_IntForEachEntry( vInds, Ind, i )
    {
        int fOffSet = (int)(i < nCareMints[0]);
        int status, k, iLit = Abc_Var2Lit( PivotVar, fOffSet );
        sat_solver_random_polarity( pSat );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return fOffSet;
        for ( k = 0; k <= PivotVar; k++ )
            if ( Abc_TtGetBit(pVarSims[k], Ind) != sat_solver_var_value(pSat, k) )
                Abc_TtXorBit(pVarSims[k], Ind);
    }
    return -1;
}